

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

int gauden_invert_variance(gauden_t *g)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = g->n_mgau;
  for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
    uVar2 = g->n_feat;
    for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
      uVar3 = g->n_density;
      for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
        uVar4 = g->veclen[uVar6];
        for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
          g->var[uVar5][uVar6][uVar7][uVar8] = 1.0 / g->var[uVar5][uVar6][uVar7][uVar8];
        }
      }
    }
  }
  return 0;
}

Assistant:

int
gauden_invert_variance(gauden_t *g)
{
    uint32 i, j, k, l;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_density; k++) {
		for (l = 0; l < g->veclen[j]; l++) {
		    g->var[i][j][k][l] = 1.0 / g->var[i][j][k][l];
		}
	    }
	}
    }

    return S3_SUCCESS;
}